

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VkBootstrap.cpp
# Opt level: O1

int __thiscall
vkb::PhysicalDeviceSelector::select
          (PhysicalDeviceSelector *this,int __nfds,fd_set *__readfds,fd_set *__writefds,
          fd_set *__exceptfds,timeval *__timeout)

{
  undefined1 uVar1;
  undefined4 in_register_00000034;
  Result<std::vector<vkb::PhysicalDevice,_std::allocator<vkb::PhysicalDevice>_>_> selected_devices;
  anon_union_24_2_293c120a_for_Result<std::vector<vkb::PhysicalDevice,_std::allocator<vkb::PhysicalDevice>_>_>_1
  local_38;
  char local_20;
  
  select_impl((Result<std::vector<vkb::PhysicalDevice,_std::allocator<vkb::PhysicalDevice>_>_> *)
              &local_38.m_value,(PhysicalDeviceSelector *)CONCAT44(in_register_00000034,__nfds));
  if (local_20 != '\0') {
    if (local_38.m_value.
        super__Vector_base<vkb::PhysicalDevice,_std::allocator<vkb::PhysicalDevice>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        (PhysicalDevice *)CONCAT44(local_38._4_4_,local_38.m_error.type._M_value)) {
      uVar1 = 1;
      PhysicalDevice::PhysicalDevice
                ((PhysicalDevice *)this,
                 (PhysicalDevice *)CONCAT44(local_38._4_4_,local_38.m_error.type._M_value));
      goto LAB_001091b8;
    }
    local_38.m_value.super__Vector_base<vkb::PhysicalDevice,_std::allocator<vkb::PhysicalDevice>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)&detail::physical_device_error_category;
    local_38.m_error.type._M_value = 3;
  }
  *(undefined4 *)&(this->instance_info).instance = local_38.m_error.type._M_value;
  (this->instance_info).surface =
       (VkSurfaceKHR)
       local_38.m_value.
       super__Vector_base<vkb::PhysicalDevice,_std::allocator<vkb::PhysicalDevice>_>._M_impl.
       super__Vector_impl_data._M_finish;
  (this->instance_info).version = 0;
  uVar1 = 0;
LAB_001091b8:
  *(undefined1 *)&this[2].criteria.required_features2.features.sparseResidencyImage2D = uVar1;
  if (local_20 == '\x01') {
    std::vector<vkb::PhysicalDevice,_std::allocator<vkb::PhysicalDevice>_>::~vector
              (&local_38.m_value);
  }
  return (int)this;
}

Assistant:

Result<PhysicalDevice> PhysicalDeviceSelector::select() const {
    auto const selected_devices = select_impl();

    if (!selected_devices) return Result<PhysicalDevice>{ selected_devices.error() };
    if (selected_devices.value().size() == 0) {
        return Result<PhysicalDevice>{ PhysicalDeviceError::no_suitable_device };
    }

    return selected_devices.value().at(0);
}